

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_writer.cpp
# Opt level: O2

void __thiscall VM_Writer::write_pop(VM_Writer *this,string *segment,int index)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  poVar1 = (ostream *)this->out_file;
  std::operator+(&local_38,"pop ",segment);
  std::operator+(&bStack_58,&local_38," ");
  poVar1 = std::operator<<(poVar1,(string *)&bStack_58);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,index);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void VM_Writer::write_pop(const std::string &segment, int index) {
    out_file << "pop " + segment + " " << index << std::endl;
}